

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameWithClusterInfo.h
# Opt level: O1

TypeCluster * __thiscall
BayesianGameWithClusterInfo::GetTypeCluster(BayesianGameWithClusterInfo *this,Index agI,Index tcI)

{
  pointer ppvVar1;
  vector<TypeCluster_*,_std::allocator<TypeCluster_*>_> *pvVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)agI;
  ppvVar1 = (this->_m_typeLists).
            super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar4 = (long)(this->_m_typeLists).
                super__Vector_base<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*,_std::allocator<std::vector<TypeCluster_*,_std::allocator<TypeCluster_*>_>_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppvVar1 >> 3;
  if (uVar5 < uVar4) {
    pvVar2 = ppvVar1[uVar5];
    uVar5 = (ulong)tcI;
    lVar3 = *(long *)&(pvVar2->super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                      _M_impl.super__Vector_impl_data;
    uVar4 = (long)*(pointer *)
                   ((long)&(pvVar2->
                           super__Vector_base<TypeCluster_*,_std::allocator<TypeCluster_*>_>).
                           _M_impl.super__Vector_impl_data + 8) - lVar3 >> 3;
    if (uVar5 < uVar4) {
      return *(TypeCluster **)(lVar3 + uVar5 * 8);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5,uVar4
            );
}

Assistant:

const TypeCluster* GetTypeCluster(Index agI, Index tcI) const
        {return _m_typeLists.at(agI)->at(tcI);}